

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O3

void __thiscall
ktx::DiffComplex<KTXcubemapIncomplete>::printText
          (DiffComplex<KTXcubemapIncomplete> *this,size_t index,PrintIndent *out,char *prefix)

{
  undefined1 auVar1 [16];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *vargs;
  char *pcVar2;
  char *pcVar3;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_string_view<char> format_str_08;
  basic_string_view<char> format_str_09;
  basic_string_view<char> format_str_10;
  basic_string_view<char> format_str_11;
  basic_string_view<char> format_str_12;
  basic_string_view<char> format_str_13;
  basic_string_view<char> format_str_14;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_00;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_01;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_02;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_03;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_04;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_05;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_06;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_07;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_08;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_09;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_10;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_11;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_12;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_13;
  char *local_78;
  size_type sStack_70;
  char *local_68;
  string local_50;
  
  if (*(int *)((long)&this->values[index].super__Optional_base<KTXcubemapIncomplete,_false,_false>.
                      _M_payload.super__Optional_payload<KTXcubemapIncomplete,_true,_false,_false>.
                      super__Optional_payload_base<KTXcubemapIncomplete>._M_payload + 0x10) != 1) {
    KVEntry::extractRawBytes_abi_cxx11_(&local_50,(KVEntry *)(this->values + index),true," ");
    local_68 = (char *)(ulong)(uint)(out->indentBase * out->indentWidth);
    local_78 = "";
    format_str_13.size_ = 5;
    format_str_13.data_ = "{:{}}";
    args_12.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_78;
    args_12.desc_ = 0x1c;
    ::fmt::v10::vprint<char>(out->os,format_str_13,args_12);
    local_78 = local_50._M_dataplus._M_p;
    sStack_70 = local_50._M_string_length;
    format_str_14.size_ = 4;
    format_str_14.data_ = " {}\n";
    args_13.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_78;
    args_13.desc_ = 0xd;
    ::fmt::v10::vprint<char>(out->os,format_str_14,args_13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  local_68 = (char *)(ulong)(uint)(out->indentBase * out->indentWidth);
  local_78 = "";
  format_str.size_ = 5;
  format_str.data_ = "{:{}}";
  args.field_1.values_ =
       (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_78;
  args.desc_ = 0x1c;
  ::fmt::v10::vprint<char>(out->os,format_str,args);
  format_str_00.size_ = 1;
  format_str_00.data_ = "\n";
  auVar1._8_8_ = 0;
  auVar1._0_8_ = &local_78;
  ::fmt::v10::vprint<char>
            (out->os,format_str_00,
             (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>)
             (auVar1 << 0x40));
  if (*(int *)((long)&this->values[index].super__Optional_base<KTXcubemapIncomplete,_false,_false>.
                      _M_payload.super__Optional_payload<KTXcubemapIncomplete,_true,_false,_false>.
                      super__Optional_payload_base<KTXcubemapIncomplete>._M_payload + 0x10) == 1) {
    local_68 = (char *)(ulong)(uint)(out->indentBase * out->indentWidth);
    local_78 = "";
    pcVar3 = "true";
    pcVar2 = "true";
    if ((**(byte **)((long)&this->values[index].
                            super__Optional_base<KTXcubemapIncomplete,_false,_false>._M_payload.
                            super__Optional_payload<KTXcubemapIncomplete,_true,_false,_false>.
                            super__Optional_payload_base<KTXcubemapIncomplete>._M_payload._M_value.
                            super_KVEntry + 8) & 1) == 0) {
      pcVar2 = "false;";
    }
    format_str_01.size_ = 5;
    format_str_01.data_ = "{:{}}";
    args_00.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_78;
    args_00.desc_ = 0x1c;
    ::fmt::v10::vprint<char>(out->os,format_str_01,args_00);
    format_str_02.size_ = 0x14;
    format_str_02.data_ = "{}    positiveX: {}\n";
    args_01.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_78;
    args_01.desc_ = 0xcc;
    local_78 = prefix;
    local_68 = pcVar2;
    ::fmt::v10::vprint<char>(out->os,format_str_02,args_01);
    if (*(int *)((long)&this->values[index].super__Optional_base<KTXcubemapIncomplete,_false,_false>
                        ._M_payload.
                        super__Optional_payload<KTXcubemapIncomplete,_true,_false,_false>.
                        super__Optional_payload_base<KTXcubemapIncomplete>._M_payload + 0x10) == 1)
    {
      local_68 = (char *)(ulong)(uint)(out->indentBase * out->indentWidth);
      local_78 = "";
      pcVar2 = "true";
      if ((**(byte **)((long)&this->values[index].
                              super__Optional_base<KTXcubemapIncomplete,_false,_false>._M_payload.
                              super__Optional_payload<KTXcubemapIncomplete,_true,_false,_false>.
                              super__Optional_payload_base<KTXcubemapIncomplete>._M_payload._M_value
                              .super_KVEntry + 8) & 2) == 0) {
        pcVar2 = "false;";
      }
      format_str_03.size_ = 5;
      format_str_03.data_ = "{:{}}";
      args_02.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_78;
      args_02.desc_ = 0x1c;
      ::fmt::v10::vprint<char>(out->os,format_str_03,args_02);
      format_str_04.size_ = 0x14;
      format_str_04.data_ = "{}    negativeX: {}\n";
      args_03.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_78;
      args_03.desc_ = 0xcc;
      local_78 = prefix;
      local_68 = pcVar2;
      ::fmt::v10::vprint<char>(out->os,format_str_04,args_03);
      if (*(int *)((long)&this->values[index].
                          super__Optional_base<KTXcubemapIncomplete,_false,_false>._M_payload.
                          super__Optional_payload<KTXcubemapIncomplete,_true,_false,_false>.
                          super__Optional_payload_base<KTXcubemapIncomplete>._M_payload + 0x10) == 1
         ) {
        local_68 = (char *)(ulong)(uint)(out->indentBase * out->indentWidth);
        local_78 = "";
        pcVar2 = "true";
        if ((**(byte **)((long)&this->values[index].
                                super__Optional_base<KTXcubemapIncomplete,_false,_false>._M_payload.
                                super__Optional_payload<KTXcubemapIncomplete,_true,_false,_false>.
                                super__Optional_payload_base<KTXcubemapIncomplete>._M_payload.
                                _M_value.super_KVEntry + 8) & 4) == 0) {
          pcVar2 = "false;";
        }
        format_str_05.size_ = 5;
        format_str_05.data_ = "{:{}}";
        args_04.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_78;
        args_04.desc_ = 0x1c;
        ::fmt::v10::vprint<char>(out->os,format_str_05,args_04);
        format_str_06.size_ = 0x14;
        format_str_06.data_ = "{}    positiveY: {}\n";
        args_05.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_78;
        args_05.desc_ = 0xcc;
        local_78 = prefix;
        local_68 = pcVar2;
        ::fmt::v10::vprint<char>(out->os,format_str_06,args_05);
        if (*(int *)((long)&this->values[index].
                            super__Optional_base<KTXcubemapIncomplete,_false,_false>._M_payload.
                            super__Optional_payload<KTXcubemapIncomplete,_true,_false,_false>.
                            super__Optional_payload_base<KTXcubemapIncomplete>._M_payload + 0x10) ==
            1) {
          local_68 = (char *)(ulong)(uint)(out->indentBase * out->indentWidth);
          local_78 = "";
          pcVar2 = "true";
          if ((**(byte **)((long)&this->values[index].
                                  super__Optional_base<KTXcubemapIncomplete,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<KTXcubemapIncomplete,_true,_false,_false>.
                                  super__Optional_payload_base<KTXcubemapIncomplete>._M_payload.
                                  _M_value.super_KVEntry + 8) & 8) == 0) {
            pcVar2 = "false;";
          }
          format_str_07.size_ = 5;
          format_str_07.data_ = "{:{}}";
          args_06.field_1.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_78;
          args_06.desc_ = 0x1c;
          ::fmt::v10::vprint<char>(out->os,format_str_07,args_06);
          format_str_08.size_ = 0x14;
          format_str_08.data_ = "{}    negativeY: {}\n";
          args_07.field_1.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_78;
          args_07.desc_ = 0xcc;
          local_78 = prefix;
          local_68 = pcVar2;
          ::fmt::v10::vprint<char>(out->os,format_str_08,args_07);
          if (*(int *)((long)&this->values[index].
                              super__Optional_base<KTXcubemapIncomplete,_false,_false>._M_payload.
                              super__Optional_payload<KTXcubemapIncomplete,_true,_false,_false>.
                              super__Optional_payload_base<KTXcubemapIncomplete>._M_payload + 0x10)
              == 1) {
            local_68 = (char *)(ulong)(uint)(out->indentBase * out->indentWidth);
            local_78 = "";
            pcVar2 = "true";
            if ((**(byte **)((long)&this->values[index].
                                    super__Optional_base<KTXcubemapIncomplete,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<KTXcubemapIncomplete,_true,_false,_false>
                                    .super__Optional_payload_base<KTXcubemapIncomplete>._M_payload.
                                    _M_value.super_KVEntry + 8) & 0x10) == 0) {
              pcVar2 = "false;";
            }
            format_str_09.size_ = 5;
            format_str_09.data_ = "{:{}}";
            args_08.field_1.values_ =
                 (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_78;
            args_08.desc_ = 0x1c;
            ::fmt::v10::vprint<char>(out->os,format_str_09,args_08);
            format_str_10.size_ = 0x14;
            format_str_10.data_ = "{}    positiveZ: {}\n";
            args_09.field_1.values_ =
                 (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_78;
            args_09.desc_ = 0xcc;
            local_78 = prefix;
            local_68 = pcVar2;
            ::fmt::v10::vprint<char>(out->os,format_str_10,args_09);
            if (*(int *)((long)&this->values[index].
                                super__Optional_base<KTXcubemapIncomplete,_false,_false>._M_payload.
                                super__Optional_payload<KTXcubemapIncomplete,_true,_false,_false>.
                                super__Optional_payload_base<KTXcubemapIncomplete>._M_payload + 0x10
                        ) == 1) {
              local_68 = (char *)(ulong)(uint)(out->indentBase * out->indentWidth);
              local_78 = "";
              if ((**(byte **)((long)&this->values[index].
                                      super__Optional_base<KTXcubemapIncomplete,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<KTXcubemapIncomplete,_true,_false,_false>
                                      .super__Optional_payload_base<KTXcubemapIncomplete>._M_payload
                                      ._M_value.super_KVEntry + 8) & 0x20) == 0) {
                pcVar3 = "false;";
              }
              format_str_11.size_ = 5;
              format_str_11.data_ = "{:{}}";
              args_10.field_1.values_ =
                   (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_78;
              args_10.desc_ = 0x1c;
              ::fmt::v10::vprint<char>(out->os,format_str_11,args_10);
              format_str_12.size_ = 0x14;
              format_str_12.data_ = "{}    negativeZ: {}\n";
              args_11.field_1.values_ =
                   (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_78;
              args_11.desc_ = 0xcc;
              local_78 = prefix;
              local_68 = pcVar3;
              ::fmt::v10::vprint<char>(out->os,format_str_12,args_11);
              return;
            }
          }
        }
      }
    }
  }
  __assert_fail("isValid()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp"
                ,0x7f0,
                "const char *ktx::CommandCompare::compareKVEntry(PrintDiff &, const std::string_view &, ktxHashListEntry *, ktxHashListEntry *)::KTXcubemapIncomplete::bitValue(uint8_t) const"
               );
}

Assistant:

void printText(std::size_t index, PrintIndent& out, const char* prefix) const {
        values[index]->printText(out, prefix);
    }